

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O3

SiameseResult __thiscall
siamese::Encoder::GenerateCauchyPacket(Encoder *this,SiameseRecoveryPacket *packet)

{
  ostringstream *this_00;
  EncoderSubwindow *pEVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  SiameseResult SVar4;
  uint8_t *puVar5;
  OutputWorker *this_01;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong __n;
  uint local_1dc;
  undefined1 local_1b8 [392];
  
  uVar7 = (this->Window).LongestPacket;
  uVar14 = (this->Window).FirstUnremovedElement;
  uVar15 = uVar7 + 8;
  puVar5 = pktalloc::Allocator::Reallocate
                     (&this->TheAllocator,(this->RecoveryPacket).Data,uVar15,Uninitialized);
  (this->RecoveryPacket).Data = puVar5;
  if (puVar5 == (uint8_t *)0x0) {
    uVar15 = 0;
  }
  (this->RecoveryPacket).Bytes = uVar15;
  if (puVar5 == (uint8_t *)0x0) {
    (this->Window).EmergencyDisabled = true;
    SVar4 = Siamese_Disabled;
  }
  else {
    uVar9 = (this->Window).ColumnStart;
    uVar13 = (this->Window).Count - (this->Window).FirstUnremovedElement;
    uVar15 = uVar14 + uVar9;
    uVar9 = this->NextParityColumn - uVar9 & 0x3fffff;
    if (uVar14 < uVar9 && uVar9 < 0x200000) {
      uVar9 = this->NextCauchyRow;
      local_1dc = uVar9 + 1;
      uVar6 = local_1dc;
      if (0xbf < local_1dc) {
        uVar6 = 0;
      }
      uVar11 = uVar15 & 0x3f;
      this->NextCauchyRow = uVar6;
      uVar6 = uVar9 + 0x40 & 0xff;
      pEVar1 = (this->Window).Subwindows.DataPtr[uVar14 >> 6];
      uVar9 = (pEVar1->Originals)._M_elems[uVar14 & 0x3f].Buffer.Bytes;
      uVar8 = (ulong)uVar9;
      gf256_mul_mem(puVar5,(pEVar1->Originals)._M_elems[uVar14 & 0x3f].Buffer.Data,
                    GF256Ctx.GF256_INV_TABLE[uVar6 ^ uVar11],uVar9);
      memset((this->RecoveryPacket).Data + uVar8,0,(ulong)(uVar7 - uVar9));
      uVar7 = (this->Window).Count;
      uVar14 = uVar14 + 1;
      __n = uVar8;
      if (uVar14 < uVar7) {
        do {
          uVar11 = uVar11 + 1 & 0x3f;
          pEVar1 = (this->Window).Subwindows.DataPtr[uVar14 >> 6];
          uVar9 = (pEVar1->Originals)._M_elems[uVar14 & 0x3f].Buffer.Bytes;
          gf256_muladd_mem((this->RecoveryPacket).Data,GF256Ctx.GF256_INV_TABLE[uVar11 ^ uVar6],
                           (pEVar1->Originals)._M_elems[uVar14 & 0x3f].Buffer.Data,uVar9);
          __n = (ulong)uVar9;
          if (uVar9 < (uint)uVar8) {
            __n = uVar8;
          }
          uVar14 = uVar14 + 1;
          uVar8 = __n;
        } while (uVar7 != uVar14);
      }
    }
    else {
      this->NextParityColumn = uVar15 + uVar13 & 0x3fffff;
      pEVar1 = (this->Window).Subwindows.DataPtr[uVar14 >> 6];
      uVar9 = (pEVar1->Originals)._M_elems[uVar14 & 0x3f].Buffer.Bytes;
      __n = (ulong)uVar9;
      memcpy(puVar5,(pEVar1->Originals)._M_elems[uVar14 & 0x3f].Buffer.Data,__n);
      local_1dc = 0;
      memset((this->RecoveryPacket).Data + __n,0,(ulong)(uVar7 - uVar9));
      uVar7 = (this->Window).Count;
      uVar14 = uVar14 + 1;
      uVar8 = __n;
      if (uVar14 < uVar7) {
        do {
          pEVar1 = (this->Window).Subwindows.DataPtr[uVar14 >> 6];
          uVar9 = (pEVar1->Originals)._M_elems[uVar14 & 0x3f].Buffer.Bytes;
          gf256_add_mem((this->RecoveryPacket).Data,
                        (pEVar1->Originals)._M_elems[uVar14 & 0x3f].Buffer.Data,uVar9);
          __n = (ulong)uVar9;
          if (uVar9 < (uint)uVar8) {
            __n = uVar8;
          }
          uVar14 = uVar14 + 1;
          uVar8 = __n;
        } while (uVar7 != uVar14);
      }
    }
    puVar5 = (this->RecoveryPacket).Data + __n;
    uVar7 = 0;
    if (1 < uVar13) {
      *puVar5 = (uint8_t)local_1dc;
      uVar7 = 2;
      puVar5[1] = (uint8_t)uVar13;
      if (0x7f < uVar13) {
        puVar5[2] = (byte)(uVar13 >> 8) | 0x80;
        uVar7 = 3;
      }
    }
    uVar8 = (ulong)uVar7;
    if ((uVar15 & 0x3fffff) < 0x80) {
      puVar5[uVar8] = (uint8_t)uVar15;
      uVar7 = 1;
    }
    else {
      bVar3 = (byte)(uVar15 >> 8);
      puVar5[uVar8] = (uint8_t)uVar15;
      if ((uVar15 & 0x3fffff) < 0x4000) {
        puVar5[uVar8 + 1] = bVar3 | 0x80;
        uVar7 = 2;
      }
      else {
        puVar5[uVar8 + 1] = bVar3;
        uVar7 = 3;
        puVar5[uVar8 + 2] = (byte)(uVar15 >> 0x10) | 0xc0;
      }
    }
    lVar10 = uVar7 + uVar8;
    uVar13 = uVar13 - 1;
    iVar12 = 1;
    if (0x7f < uVar13) {
      puVar5[lVar10 + 1] = (byte)(uVar13 >> 8) | 0x80;
      iVar12 = 2;
    }
    puVar5[lVar10] = (uint8_t)uVar13;
    uVar15 = (int)__n + (int)lVar10 + iVar12;
    packet->Data = (this->RecoveryPacket).Data;
    packet->DataBytes = uVar15;
    if (DAT_001b9078 < 3) {
      this_00 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger;
      local_1b8._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,DAT_001b90a8,DAT_001b90b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Generated Cauchy/parity recovery packet start=",0x2e);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ldpcCount=",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," sumCount=",10);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," row=",5);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      this_01 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      uVar15 = packet->DataBytes;
    }
    auVar2 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar2 = vpinsrq_avx(auVar2,(ulong)uVar15,1);
    auVar2 = vpaddq_avx(auVar2,*(undefined1 (*) [16])((this->Stats).Counts + 2));
    SVar4 = Siamese_Success;
    *(undefined1 (*) [16])((this->Stats).Counts + 2) = auVar2;
  }
  return SVar4;
}

Assistant:

SiameseResult Encoder::GenerateCauchyPacket(SiameseRecoveryPacket& packet)
{
    // Reset recovery packet
    const unsigned firstElement  = Window.FirstUnremovedElement;
    const unsigned recoveryBytes = Window.LongestPacket;
    if (!RecoveryPacket.Initialize(&TheAllocator, recoveryBytes + kMaxRecoveryMetadataBytes))
    {
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }

    const unsigned unacknowledgedCount = Window.GetUnacknowledgedCount();
    RecoveryMetadata metadata;
    metadata.SumCount    = unacknowledgedCount;
    metadata.LDPCCount   = unacknowledgedCount;
    metadata.ColumnStart = Window.ElementToColumn(firstElement);

    // We have to recalculate the number of used bytes since the Cauchy/parity rows may be
    // shorter since they do not need to contain the start of the window which may be acked.
    unsigned usedBytes = 0;

    // If it is time to generate a new parity row:
    const unsigned nextParityElement = Window.ColumnToElement(NextParityColumn);
    if (nextParityElement <= firstElement || IsColumnDeltaNegative(nextParityElement))
    {
        // Set next time we write a parity row
        NextParityColumn = AddColumns(metadata.ColumnStart, unacknowledgedCount);

        // Row 0 is a parity row
        metadata.Row = 0;

        // Unroll first column
        OriginalPacket* original = Window.GetWindowElement(firstElement);
        unsigned originalBytes   = original->Buffer.Bytes;

        memcpy(RecoveryPacket.Data, original->Buffer.Data, originalBytes);
        // Pad the rest out with zeros to avoid corruption
        SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);
        memset(RecoveryPacket.Data + originalBytes, 0, recoveryBytes - originalBytes);

        usedBytes = originalBytes;

        // For each remaining column:
        for (unsigned element = firstElement + 1, count = Window.Count; element < count; ++element)
        {
            original      = Window.GetWindowElement(element);
            originalBytes = original->Buffer.Bytes;

            SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);

            gf256_add_mem(RecoveryPacket.Data, original->Buffer.Data, originalBytes);

            if (usedBytes < originalBytes)
                usedBytes = originalBytes;
        }
    }
    else
    {
        // Select Cauchy row number
        const unsigned cauchyRow = NextCauchyRow;
        metadata.Row = cauchyRow + 1;
        if (++NextCauchyRow >= kCauchyMaxRows)
            NextCauchyRow = 0;

        // Unroll first column
        unsigned cauchyColumn    = metadata.ColumnStart % kCauchyMaxColumns;
        OriginalPacket* original = Window.GetWindowElement(firstElement);
        uint8_t y                = CauchyElement(cauchyRow, cauchyColumn);
        unsigned originalBytes   = original->Buffer.Bytes;

        gf256_mul_mem(RecoveryPacket.Data, original->Buffer.Data, y, originalBytes);
        // Pad the rest out with zeros to avoid corruption
        SIAMESE_DEBUG_ASSERT(recoveryBytes >= originalBytes);
        SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);
        memset(RecoveryPacket.Data + originalBytes, 0, recoveryBytes - originalBytes);

        usedBytes = originalBytes;

        // For each remaining column:
        for (unsigned element = firstElement + 1, count = Window.Count; element < count; ++element)
        {
            cauchyColumn  = (cauchyColumn + 1) % kCauchyMaxColumns;
            original      = Window.GetWindowElement(element);
            originalBytes = original->Buffer.Bytes;
            y             = CauchyElement(cauchyRow, cauchyColumn);

            SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);

            gf256_muladd_mem(RecoveryPacket.Data, y, original->Buffer.Data, originalBytes);

            if (usedBytes < originalBytes)
                usedBytes = originalBytes;
        }
    }

    // Slap metadata footer on the end
    const unsigned footerBytes = SerializeFooter_RecoveryMetadata(metadata, RecoveryPacket.Data + usedBytes);

    packet.Data      = RecoveryPacket.Data;
    packet.DataBytes = usedBytes + footerBytes;

    Logger.Info("Generated Cauchy/parity recovery packet start=", metadata.ColumnStart, " ldpcCount=", metadata.LDPCCount, " sumCount=", metadata.SumCount, " row=", metadata.Row);

    Stats.Counts[SiameseEncoderStats_RecoveryCount]++;
    Stats.Counts[SiameseEncoderStats_RecoveryBytes] += packet.DataBytes;

    return Siamese_Success;
}